

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareLineSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  D *b;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar1;
  longdouble lVar2;
  longdouble in_ST2;
  longdouble in_ST3;
  __type_conflict _Var3;
  double __x;
  double __x_00;
  int local_1cc;
  longdouble error;
  longdouble diff;
  longdouble xDn2_error;
  longdouble c1;
  longdouble xDn2;
  D local_e8;
  longdouble xDn;
  longdouble ax2;
  longdouble n2sin2_r_error;
  longdouble n2sin2_r;
  longdouble T_ERR;
  longdouble n2_local;
  longdouble n1_local;
  BasicVector<Vector3,_long_double,_3UL> *local_40;
  Vector3<long_double> *n_local;
  longdouble r2_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  Vector3<long_double> *x_local;
  
  _n_local = r2;
  stack0xffffffffffffffa8 = n1;
  stack0xffffffffffffff98 = n2;
  register0x00001100 = (longdouble)5.421011e-20;
  if (r2 < (longdouble)2.0) {
    register0x00001110 = ((longdouble)1 + (longdouble)-0.25 * r2) * n2 * r2;
    register0x00001110 = (longdouble)3.2526065e-19 * register0x00001110;
    local_40 = (BasicVector<Vector3,_long_double,_3UL> *)n;
    unique0x100000d6 = a1;
    a1_local = a0;
    a0_local = x;
    GetClosestVertex<long_double>
              ((Vector3<long_double> *)((long)&xDn2 + 8),x,a0,a1,(longdouble *)((long)&xDn + 8));
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
              (&local_e8,(BasicVector<Vector3,_long_double,_3UL> *)x,
               (Vector3<long_double> *)((long)&xDn2 + 8));
    this = local_40;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
              ((longdouble *)&local_e8,local_40,b);
    _Var3 = std::sqrt<int>(3);
    lVar1 = stack0xffffffffffffffa8 * (longdouble)(_Var3 + _Var3 + 3.5);
    _Var3 = std::sqrt<int>(3);
    __x = _Var3 * 32.0 * 1.1102230246251565e-16;
    __x_00 = std::sqrt(__x);
    in_ST1 = (longdouble)5.421011e-20 * ((longdouble)__x + lVar1) * in_ST1;
    std::fabs(__x_00);
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
              ((longdouble *)a0_local,this);
    lVar1 = in_ST0 * in_ST0 - stack0xffffffffffffff78 * in_ST3;
    lVar2 = stack0xffffffffffffff68 + stack0xffffffffffffff78 * in_ST3 * (longdouble)2.1684043e-19 +
            in_ST1 * (in_ST2 + in_ST2 + in_ST1) + (longdouble)2.1684043e-19 * in_ST0 * in_ST0;
    if (lVar1 <= lVar2) {
      local_1cc = -(uint)(lVar1 < -lVar2);
    }
    else {
      local_1cc = 1;
    }
    x_local._4_4_ = local_1cc;
  }
  else {
    x_local._4_4_ = -1;
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}